

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

exr_result_t
validate_channels(_internal_exr_context *f,_internal_exr_part *curpart,exr_attr_chlist_t *channels)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  exr_attr_chlist_entry_t *peVar5;
  long lVar6;
  exr_result_t eVar7;
  _func_exr_result_t__internal_exr_context_ptr_exr_result_t_char_ptr *UNRECOVERED_JUMPTABLE;
  undefined8 uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  _func_exr_result_t__internal_exr_context_ptr_exr_result_t_char_ptr_varargs
  *UNRECOVERED_JUMPTABLE_01;
  long lVar14;
  
  if (channels == (exr_attr_chlist_t *)0x0) {
    UNRECOVERED_JUMPTABLE = f->report_error;
    pcVar9 = "Missing required channels attribute to validate against";
    eVar7 = 3;
  }
  else if (curpart->dataWindow == (exr_attribute_t *)0x0) {
    UNRECOVERED_JUMPTABLE = f->report_error;
    pcVar9 = "request to validate channel list, but data window not set to validate against";
    eVar7 = 0xf;
  }
  else {
    if (0 < (long)channels->num_channels) {
      iVar1 = (curpart->data_window).min.field_0.field_0.x;
      uVar10 = (ulong)iVar1;
      uVar2 = (curpart->data_window).min.field_0.field_0.y;
      lVar12 = ((long)(curpart->data_window).max.field_0.field_0.x - uVar10) + 1;
      lVar13 = ((long)(curpart->data_window).max.field_0.field_0.y - (long)(int)uVar2) + 1;
      peVar5 = channels->entries;
      lVar6 = 0;
      do {
        lVar14 = lVar6;
        if ((long)channels->num_channels * 0x20 + 0x20 == lVar14 + 0x20) {
          return 0;
        }
        uVar3 = *(uint *)(peVar5->reserved + lVar14 + 3);
        if ((long)(int)uVar3 < 1) {
          eVar7 = (*f->print_error)(f,0xe,"channel \'%s\': x subsampling factor is invalid (%d)",
                                    *(undefined8 *)(peVar5->reserved + lVar14 + -0xd),(ulong)uVar3,
                                    f->print_error);
          return eVar7;
        }
        uVar4 = *(uint *)(peVar5->reserved + lVar14 + 7);
        uVar11 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          eVar7 = (*f->print_error)(f,0xe,"channel \'%s\': y subsampling factor is invalid (%d)",
                                    *(undefined8 *)(peVar5->reserved + lVar14 + -0xd),(ulong)uVar4);
          return eVar7;
        }
        if (iVar1 % (int)uVar3 != 0) {
          UNRECOVERED_JUMPTABLE_01 = f->print_error;
          uVar8 = *(undefined8 *)(peVar5->reserved + lVar14 + -0xd);
          pcVar9 = 
          "channel \'%s\': minimum x coordinate (%d) of the data window is not a multiple of the x subsampling factor (%d)"
          ;
          uVar11 = (ulong)uVar3;
LAB_00122b02:
          eVar7 = (*UNRECOVERED_JUMPTABLE_01)(f,0xe,pcVar9,uVar8,uVar10,uVar11);
          return eVar7;
        }
        if ((int)uVar2 % (int)uVar4 != 0) {
          UNRECOVERED_JUMPTABLE_01 = f->print_error;
          uVar8 = *(undefined8 *)(peVar5->reserved + lVar14 + -0xd);
          pcVar9 = 
          "channel \'%s\': minimum y coordinate (%d) of the data window is not a multiple of the y subsampling factor (%d)"
          ;
          uVar10 = (ulong)uVar2;
          goto LAB_00122b02;
        }
        if (lVar12 % (long)(int)uVar3 != 0) {
          UNRECOVERED_JUMPTABLE_01 = f->print_error;
          uVar8 = *(undefined8 *)(peVar5->reserved + lVar14 + -0xd);
          pcVar9 = 
          "channel \'%s\': row width (%ld) of the data window is not a multiple of the x subsampling factor (%d)"
          ;
          uVar11 = (ulong)uVar3;
          goto LAB_00122b2b;
        }
        lVar6 = lVar14 + 0x20;
        if (lVar13 % (long)uVar11 != 0) {
          UNRECOVERED_JUMPTABLE_01 = f->print_error;
          uVar8 = *(undefined8 *)(peVar5->reserved + lVar14 + -0xd);
          pcVar9 = 
          "channel \'%s\': column height (%ld) of the data window is not a multiple of the y subsampling factor (%d)"
          ;
          lVar12 = lVar13;
LAB_00122b2b:
          eVar7 = (*UNRECOVERED_JUMPTABLE_01)(f,0xe,pcVar9,uVar8,lVar12,uVar11);
          return eVar7;
        }
      } while( true );
    }
    UNRECOVERED_JUMPTABLE = f->report_error;
    pcVar9 = "At least one channel required";
    eVar7 = 6;
  }
  eVar7 = (*UNRECOVERED_JUMPTABLE)(f,eVar7,pcVar9);
  return eVar7;
}

Assistant:

static exr_result_t
validate_channels (
    struct _internal_exr_context* f,
    struct _internal_exr_part*    curpart,
    const exr_attr_chlist_t*      channels)
{
    exr_attr_box2i_t dw;
    int64_t          w, h;

    if (!channels)
        return f->report_error (
            f,
            EXR_ERR_INVALID_ARGUMENT,
            "Missing required channels attribute to validate against");
    if (!curpart->dataWindow)
        return f->report_error (
            f,
            EXR_ERR_NO_ATTR_BY_NAME,
            "request to validate channel list, but data window not set to validate against");

    if (channels->num_channels <= 0)
        return f->report_error (
            f, EXR_ERR_FILE_BAD_HEADER, "At least one channel required");

    dw = curpart->data_window;
    w  = (int64_t) dw.max.x - (int64_t) dw.min.x + 1;
    h  = (int64_t) dw.max.y - (int64_t) dw.min.y + 1;

    for (int c = 0; c < channels->num_channels; ++c)
    {
        int32_t xsamp = channels->entries[c].x_sampling;
        int32_t ysamp = channels->entries[c].y_sampling;

        if (xsamp < 1)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': x subsampling factor is invalid (%d)",
                channels->entries[c].name.str,
                xsamp);
        if (ysamp < 1)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': y subsampling factor is invalid (%d)",
                channels->entries[c].name.str,
                ysamp);
        if (dw.min.x % xsamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': minimum x coordinate (%d) of the data window is not a multiple of the x subsampling factor (%d)",
                channels->entries[c].name.str,
                dw.min.x,
                xsamp);
        if (dw.min.y % ysamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': minimum y coordinate (%d) of the data window is not a multiple of the y subsampling factor (%d)",
                channels->entries[c].name.str,
                dw.min.y,
                ysamp);
        if (w % xsamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': row width (%" PRId64
                ") of the data window is not a multiple of the x subsampling factor (%d)",
                channels->entries[c].name.str,
                w,
                xsamp);
        if (h % ysamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': column height (%" PRId64
                ") of the data window is not a multiple of the y subsampling factor (%d)",
                channels->entries[c].name.str,
                h,
                ysamp);
    }

    return EXR_ERR_SUCCESS;
}